

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262.c
# Opt level: O2

int h262_picparm_ext(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm)

{
  int iVar1;
  int iVar2;
  
  iVar1 = vs_u(str,picparm->f_code[0],4);
  iVar2 = 1;
  if ((((iVar1 == 0) && (iVar1 = vs_u(str,picparm->f_code[0] + 1,4), iVar1 == 0)) &&
      (iVar1 = vs_u(str,picparm->f_code[1],4), iVar1 == 0)) &&
     (((iVar1 = vs_u(str,picparm->f_code[1] + 1,4), iVar1 == 0 &&
       (iVar1 = vs_u(str,&picparm->intra_dc_precision,2), iVar1 == 0)) &&
      (iVar1 = vs_u(str,&picparm->picture_structure,2), iVar1 == 0)))) {
    iVar2 = 1;
    iVar1 = vs_u(str,&picparm->top_field_first,1);
    if (iVar1 == 0) {
      iVar2 = 1;
      iVar1 = vs_u(str,&picparm->frame_pred_frame_dct,1);
      if (iVar1 == 0) {
        iVar2 = 1;
        iVar1 = vs_u(str,&picparm->concealment_motion_vectors,1);
        if (iVar1 == 0) {
          iVar2 = 1;
          iVar1 = vs_u(str,&picparm->q_scale_type,1);
          if (iVar1 == 0) {
            iVar2 = 1;
            iVar1 = vs_u(str,&picparm->intra_vlc_format,1);
            if (iVar1 == 0) {
              iVar2 = 1;
              iVar1 = vs_u(str,&picparm->alternate_scan,1);
              if (iVar1 == 0) {
                iVar2 = 1;
                iVar1 = vs_u(str,&picparm->repeat_first_field,1);
                if (iVar1 == 0) {
                  iVar2 = 1;
                  iVar1 = vs_u(str,&picparm->chroma_420_type,1);
                  if (iVar1 == 0) {
                    iVar2 = 1;
                    iVar1 = vs_u(str,&picparm->progressive_frame,1);
                    if (iVar1 == 0) {
                      iVar2 = 1;
                      iVar1 = vs_u(str,&picparm->composite_display_flag,1);
                      if (iVar1 == 0) {
                        if (picparm->composite_display_flag != 0) {
                          iVar2 = vs_u(str,&picparm->v_axis,1);
                          if (iVar2 != 0) {
                            return 1;
                          }
                          iVar2 = vs_u(str,&picparm->field_sequence,3);
                          if (iVar2 != 0) {
                            return 1;
                          }
                          iVar2 = vs_u(str,&picparm->sub_carrier,1);
                          if (iVar2 != 0) {
                            return 1;
                          }
                          iVar2 = vs_u(str,&picparm->burst_amplitude,7);
                          if (iVar2 != 0) {
                            return 1;
                          }
                          iVar2 = vs_u(str,&picparm->sub_carrier_phase,8);
                          if (iVar2 != 0) {
                            return 1;
                          }
                        }
                        picparm->is_ext = 1;
                        iVar2 = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int h262_picparm_ext(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm) {
	if (vs_u(str, &picparm->f_code[0][0], 4)) return 1;
	if (vs_u(str, &picparm->f_code[0][1], 4)) return 1;
	if (vs_u(str, &picparm->f_code[1][0], 4)) return 1;
	if (vs_u(str, &picparm->f_code[1][1], 4)) return 1;
	if (vs_u(str, &picparm->intra_dc_precision, 2)) return 1;
	if (vs_u(str, &picparm->picture_structure, 2)) return 1;
	if (vs_u(str, &picparm->top_field_first, 1)) return 1;
	if (vs_u(str, &picparm->frame_pred_frame_dct, 1)) return 1;
	if (vs_u(str, &picparm->concealment_motion_vectors, 1)) return 1;
	if (vs_u(str, &picparm->q_scale_type, 1)) return 1;
	if (vs_u(str, &picparm->intra_vlc_format, 1)) return 1;
	if (vs_u(str, &picparm->alternate_scan, 1)) return 1;
	if (vs_u(str, &picparm->repeat_first_field, 1)) return 1;
	if (vs_u(str, &picparm->chroma_420_type, 1)) return 1;
	if (vs_u(str, &picparm->progressive_frame, 1)) return 1;
	if (vs_u(str, &picparm->composite_display_flag, 1)) return 1;
	if (picparm->composite_display_flag) {
		if (vs_u(str, &picparm->v_axis, 1)) return 1;
		if (vs_u(str, &picparm->field_sequence, 3)) return 1;
		if (vs_u(str, &picparm->sub_carrier, 1)) return 1;
		if (vs_u(str, &picparm->burst_amplitude, 7)) return 1;
		if (vs_u(str, &picparm->sub_carrier_phase, 8)) return 1;
	}
	picparm->is_ext = 1;
	return 0;
}